

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtpConsole.cpp
# Opt level: O1

char * __thiscall gnl::FtpConsole::getCommand(FtpConsole *this,char *buf,char *command)

{
  char *pcVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  
  pcVar3 = buf + -2;
  do {
    pcVar1 = pcVar3 + 2;
    pcVar3 = pcVar3 + 1;
  } while (*pcVar1 == ' ');
  uVar5 = 0;
  while( true ) {
    bVar2 = pcVar3[1];
    if (((ulong)bVar2 < 0x21) && ((0x100002401U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) break;
    command[uVar5] = bVar2;
    uVar5 = uVar5 + 1;
    pcVar3 = pcVar3 + 1;
  }
  command[uVar5 & 0xffffffff] = '\0';
  do {
    pcVar1 = pcVar3 + 1;
    pcVar3 = pcVar3 + 1;
    pcVar4 = pcVar3;
  } while (*pcVar1 == ' ');
  for (; (*pcVar3 != '\n' && (*pcVar3 != '\r')); pcVar3 = pcVar3 + 1) {
  }
  *pcVar3 = '\0';
  return pcVar4;
}

Assistant:

char* FtpConsole::getCommand(char* buf, char* command){
        while(*buf == ' '){
            ++buf;
        }
        int i = 0,j = 0;
        while(*buf != ' ' && *buf != '\r' && *buf != '\n' && *buf != '\0'){
            command[i] = *buf++;
            ++i;
        }
        command[i] = '\0';
        while(*buf == ' '){
            ++buf;
        }
        char* data = buf;
        i = 0;
        while(buf[i] != '\r' && buf[i] != '\n'){
            ++i;
        }
        buf[i] = '\0';
        return data;
    }